

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O2

void Rml::MeshUtilities::GenerateBackgroundBorder
               (Mesh *out_mesh,RenderBox *render_box,ColourbPremultiplied background_color,
               ColourbPremultiplied *border_colors)

{
  Vector2f inner_size;
  pointer pVVar1;
  pointer pVVar2;
  int *piVar3;
  code *pcVar4;
  bool bVar5;
  EdgeSizes edge_sizes;
  EdgeSizes edge_sizes_00;
  bool bVar6;
  int i;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  GeometryBackgroundBorder geometry;
  undefined8 local_d0;
  undefined8 uStack_c8;
  BorderMetrics metrics;
  
  if ((border_colors != (ColourbPremultiplied *)0x0) ||
     (bVar6 = Assert("RMLUI_ASSERT(border_colors)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/MeshUtilities.cpp"
                     ,0x58), bVar6)) {
    edge_sizes_00._M_elems = *&(render_box->border_widths)._M_elems;
    edge_sizes._M_elems = *&(render_box->border_widths)._M_elems;
    local_d0 = *(undefined8 *)(render_box->border_widths)._M_elems;
    uStack_c8 = *(undefined8 *)((render_box->border_widths)._M_elems + 2);
    iVar9 = 0;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      if ((border_colors[lVar8].alpha != '\0') && (0.0 < *(float *)((long)&local_d0 + lVar8 * 4))) {
        iVar9 = iVar9 + 1;
      }
    }
    inner_size = render_box->fill_size;
    if ((((uint)background_color < 0x1000000) || (inner_size.x <= 0.0)) ||
       (bVar6 = 0 < iVar9, inner_size.y <= 0.0)) {
      if (iVar9 < 1) {
        return;
      }
      bVar6 = true;
      iVar7 = 0;
      bVar5 = false;
      iVar10 = 0;
    }
    else {
      iVar10 = 2;
      bVar5 = true;
      iVar7 = 4;
    }
    ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
              (&out_mesh->vertices,
               (long)((int)(((long)(out_mesh->vertices).
                                   super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(out_mesh->vertices).
                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                  _M_impl.super__Vector_impl_data._M_start) / 0x14) +
                     iVar7 + iVar9 * 2));
    ::std::vector<int,_std::allocator<int>_>::reserve
              (&out_mesh->indices,
               (long)((iVar10 + iVar9 * 2) * 3 +
                     (int)((ulong)((long)(out_mesh->indices).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(out_mesh->indices).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2)));
    GeometryBackgroundBorder::GeometryBackgroundBorder
              (&geometry,&out_mesh->vertices,&out_mesh->indices);
    GeometryBackgroundBorder::ComputeBorderMetrics
              (&metrics,render_box->border_offset,edge_sizes,inner_size,
               (CornerSizes)*&(render_box->border_radius)._M_elems);
    if (bVar5) {
      GeometryBackgroundBorder::DrawBackground(&geometry,&metrics,background_color);
    }
    if (bVar6) {
      GeometryBackgroundBorder::DrawBorder(&geometry,&metrics,edge_sizes_00,border_colors);
    }
    pVVar1 = (out_mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (out_mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar11 = (out_mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar3 = (out_mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      if (piVar11 == piVar3) {
        return;
      }
      if (((int)(((long)pVVar1 - (long)pVVar2) / 0x14) <= *piVar11) &&
         (bVar6 = Assert("RMLUI_ASSERT(index < num_vertices)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/MeshUtilities.cpp"
                         ,0x8d), !bVar6)) break;
      piVar11 = piVar11 + 1;
    }
  }
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void MeshUtilities::GenerateBackgroundBorder(Mesh& out_mesh, const RenderBox& render_box, ColourbPremultiplied background_color,
	const ColourbPremultiplied border_colors[4])
{
	RMLUI_ASSERT(border_colors);

	Vector<Vertex>& vertices = out_mesh.vertices;
	Vector<int>& indices = out_mesh.indices;

	const EdgeSizes& border_widths = render_box.GetBorderWidths();
	int num_borders = 0;
	for (int i = 0; i < 4; i++)
		if (border_colors[i].alpha > 0 && border_widths[i] > 0)
			num_borders += 1;

	const Vector2f fill_size = render_box.GetFillSize();
	const bool has_background = (background_color.alpha > 0 && fill_size.x > 0 && fill_size.y > 0);
	const bool has_border = (num_borders > 0);

	if (!has_background && !has_border)
		return;

	// Reserve geometry. A conservative estimate, does not take border-radii into account and assumes same-colored borders.
	const int estimated_num_vertices = 4 * int(has_background) + 2 * num_borders;
	const int estimated_num_triangles = 2 * int(has_background) + 2 * num_borders;
	vertices.reserve((int)vertices.size() + estimated_num_vertices);
	indices.reserve((int)indices.size() + 3 * estimated_num_triangles);

	// Generate the geometry.
	GeometryBackgroundBorder geometry(vertices, indices);
	const BorderMetrics metrics =
		GeometryBackgroundBorder::ComputeBorderMetrics(render_box.GetBorderOffset(), border_widths, fill_size, render_box.GetBorderRadius());

	if (has_background)
		geometry.DrawBackground(metrics, background_color);

	if (has_border)
		geometry.DrawBorder(metrics, border_widths, border_colors);

#if 0
	// Debug draw vertices
	if (render_box.border_radius != CornerSizes{})
	{
		const int num_vertices = (int)vertices.size();
		const int num_indices = (int)indices.size();
		vertices.reserve(num_vertices + 4 * num_vertices);
		indices.reserve(num_indices + 6 * num_indices);

		for (int i = 0; i < num_vertices; i++)
			MeshUtilities::GenerateQuad(out_mesh, vertices[i].position, Vector2f(3, 3), ColourbPremultiplied(255, 0, (i % 2) == 0 ? 0 : 255));
	}
#endif

#ifdef RMLUI_DEBUG
	const int num_vertices = (int)vertices.size();
	for (int index : indices)
	{
		RMLUI_ASSERT(index < num_vertices);
	}
#endif
}